

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall
FIX::DataDictionary::checkHasRequired
          (DataDictionary *this,FieldMap *header,FieldMap *body,FieldMap *trailer,MsgType *msgType)

{
  int iVar1;
  FieldMap *header_00;
  const_iterator this_00;
  bool bVar2;
  string *psVar3;
  pointer ppVar4;
  RequiredTagMissing *pRVar5;
  pointer ppVar6;
  reference ppFVar7;
  FieldMap *group;
  const_iterator __end4;
  const_iterator __begin4;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *__range4;
  DataDictionary *pDStack_158;
  int field;
  DataDictionary *DD;
  g_const_iterator gStack_148;
  int delim;
  _Self local_140;
  g_const_iterator groups;
  string local_130;
  int *local_110;
  value_type_conflict1 *F;
  iterator __end2_2;
  iterator __begin2_2;
  MsgFields *__range2_2;
  const_iterator iF;
  MsgFields *fields;
  _Self local_d8;
  const_iterator iM;
  string local_c8;
  reference local_a8;
  value_type *NBF_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  NonBodyFields *__range2_1;
  allocator<char> local_71;
  string local_70;
  reference local_50;
  value_type *NBF;
  const_iterator __end2;
  const_iterator __begin2;
  NonBodyFields *__range2;
  MsgType *msgType_local;
  FieldMap *trailer_local;
  FieldMap *body_local;
  FieldMap *header_local;
  DataDictionary *this_local;
  
  __end2 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::begin
                     (&this->m_headerFields);
  NBF = (value_type *)
        std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::end
                  (&this->m_headerFields);
  while( true ) {
    bVar2 = std::operator!=(&__end2,(_Self *)&NBF);
    if (!bVar2) {
      __end2_1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 begin(&this->m_trailerFields);
      NBF_1 = (value_type *)
              std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::end
                        (&this->m_trailerFields);
      while( true ) {
        bVar2 = std::operator!=(&__end2_1,(_Self *)&NBF_1);
        if (!bVar2) {
          psVar3 = FieldBase::getString_abi_cxx11_((FieldBase *)msgType);
          local_d8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::find(&this->m_requiredFields,psVar3);
          fields = (MsgFields *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   ::end(&this->m_requiredFields);
          bVar2 = std::operator==(&local_d8,(_Self *)&fields);
          if (!bVar2) {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ::operator->(&local_d8);
            iF._M_node = (_Base_ptr)&ppVar4->second;
            std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator
                      ((_Rb_tree_const_iterator<int> *)&__range2_2);
            this_00._M_node = iF._M_node;
            __end2_2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(iF._M_node);
            F = (value_type_conflict1 *)
                std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00._M_node);
            while (bVar2 = std::operator!=(&__end2_2,(_Self *)&F), bVar2) {
              local_110 = std::_Rb_tree_const_iterator<int>::operator*(&__end2_2);
              bVar2 = FieldMap::isSetField(body,*local_110);
              if (!bVar2) {
                groups._M_node._6_1_ = 1;
                pRVar5 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
                iVar1 = *local_110;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_130,"",(allocator<char> *)((long)&groups._M_node + 7));
                RequiredTagMissing::RequiredTagMissing(pRVar5,iVar1,&local_130);
                groups._M_node._6_1_ = 0;
                __cxa_throw(pRVar5,&RequiredTagMissing::typeinfo,
                            RequiredTagMissing::~RequiredTagMissing);
              }
              std::_Rb_tree_const_iterator<int>::operator++(&__end2_2);
            }
            local_140._M_node = (_Base_ptr)FieldMap::g_begin(body);
            while( true ) {
              gStack_148 = FieldMap::g_end(body);
              bVar2 = std::operator!=(&local_140,&stack0xfffffffffffffeb8);
              if (!bVar2) break;
              pDStack_158 = (DataDictionary *)0x0;
              ppVar6 = std::
                       _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                       ::operator->(&local_140);
              iVar1 = ppVar6->first;
              psVar3 = StringField::getValue_abi_cxx11_(&msgType->super_StringField);
              bVar2 = getGroup(this,psVar3,iVar1,(int *)((long)&DD + 4),&stack0xfffffffffffffea8);
              if (bVar2) {
                ppVar6 = std::
                         _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                         ::operator->(&local_140);
                __end4 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin
                                   (&ppVar6->second);
                group = (FieldMap *)
                        std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end
                                  (&ppVar6->second);
                while (bVar2 = __gnu_cxx::operator!=
                                         (&__end4,(
                                                  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                                                  *)&group), bVar2) {
                  ppFVar7 = __gnu_cxx::
                            __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                            ::operator*(&__end4);
                  header_00 = *ppFVar7;
                  checkHasRequired(pDStack_158,header_00,header_00,header_00,msgType);
                  __gnu_cxx::
                  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                  ::operator++(&__end4);
                }
              }
              std::
              _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
              ::operator++(&local_140);
            }
          }
          return;
        }
        local_a8 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator*(&__end2_1);
        if (((local_a8->second & 1U) == 1) &&
           (bVar2 = FieldMap::isSetField(trailer,local_a8->first), !bVar2)) break;
        std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator++(&__end2_1);
      }
      iM._M_node._6_1_ = 1;
      pRVar5 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
      iVar1 = local_a8->first;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"",(allocator<char> *)((long)&iM._M_node + 7));
      RequiredTagMissing::RequiredTagMissing(pRVar5,iVar1,&local_c8);
      iM._M_node._6_1_ = 0;
      __cxa_throw(pRVar5,&RequiredTagMissing::typeinfo,RequiredTagMissing::~RequiredTagMissing);
    }
    local_50 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator*(&__end2);
    if (((local_50->second & 1U) == 1) &&
       (bVar2 = FieldMap::isSetField(header,local_50->first), !bVar2)) break;
    std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator++(&__end2);
  }
  pRVar5 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
  iVar1 = local_50->first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  RequiredTagMissing::RequiredTagMissing(pRVar5,iVar1,&local_70);
  __cxa_throw(pRVar5,&RequiredTagMissing::typeinfo,RequiredTagMissing::~RequiredTagMissing);
}

Assistant:

EXCEPT(RequiredTagMissing) {
    for (const NonBodyFields::value_type &NBF : m_headerFields) {
      if (NBF.second == true && !header.isSetField(NBF.first)) {
        throw RequiredTagMissing(NBF.first);
      }
    }

    for (const NonBodyFields::value_type &NBF : m_trailerFields) {
      if (NBF.second == true && !trailer.isSetField(NBF.first)) {
        throw RequiredTagMissing(NBF.first);
      }
    }

    MsgTypeToField::const_iterator iM = m_requiredFields.find(msgType.getString());
    if (iM == m_requiredFields.end()) {
      return;
    }

    const MsgFields &fields = iM->second;
    MsgFields::const_iterator iF;
    for (const MsgFields::value_type &F : fields) {
      if (!body.isSetField(F)) {
        throw RequiredTagMissing(F);
      }
    }

    for (FieldMap::g_const_iterator groups = body.g_begin(); groups != body.g_end(); ++groups) {
      int delim;
      const DataDictionary *DD = 0;
      int field = groups->first;
      if (getGroup(msgType.getValue(), field, delim, DD)) {
        for (const FieldMap *group : groups->second) {
          DD->checkHasRequired(*group, *group, *group, msgType);
        }
      }
    }
  }